

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O0

QPDFEFStreamObjectHelper *
QPDFEFStreamObjectHelper::createEFStream
          (QPDFEFStreamObjectHelper *__return_storage_ptr__,QPDF *qpdf,
          function<void_(Pipeline_*)> *provider)

{
  QPDFObjectHandle local_90;
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70 [2];
  function<void_(Pipeline_*)> local_50;
  undefined1 local_30 [8];
  QPDFObjectHandle stream;
  function<void_(Pipeline_*)> *provider_local;
  QPDF *qpdf_local;
  
  stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)provider;
  QPDF::newStream((QPDF *)local_30);
  std::function<void_(Pipeline_*)>::function(&local_50,provider);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData((QPDFObjectHandle *)local_30,&local_50,local_70,&local_80);
  QPDFObjectHandle::~QPDFObjectHandle(&local_80);
  QPDFObjectHandle::~QPDFObjectHandle(local_70);
  std::function<void_(Pipeline_*)>::~function(&local_50);
  QPDFObjectHandle::QPDFObjectHandle(&local_90,(QPDFObjectHandle *)local_30);
  newFromStream(__return_storage_ptr__,&local_90);
  QPDFObjectHandle::~QPDFObjectHandle(&local_90);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  return __return_storage_ptr__;
}

Assistant:

QPDFEFStreamObjectHelper
QPDFEFStreamObjectHelper::createEFStream(QPDF& qpdf, std::function<void(Pipeline*)> provider)
{
    auto stream = qpdf.newStream();
    stream.replaceStreamData(provider, QPDFObjectHandle::newNull(), QPDFObjectHandle::newNull());
    return newFromStream(stream);
}